

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Environmental_Process_PDU::SetEnvironmentRecords
          (Environmental_Process_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
          *ER)

{
  pointer pKVar1;
  uint uVar2;
  pointer pKVar3;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ::operator=(&this->m_vEnvRecords,ER);
  pKVar3 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui16NumEnvRec = (short)((uint)((int)pKVar1 - (int)pKVar3) >> 3) * -0x5555;
  for (; pKVar1 != pKVar3; pKVar3 = pKVar3 + 1) {
    uVar2 = (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[6])();
    (this->super_Header).super_Header6.m_ui16PDULength =
         (short)((uVar2 & 0xffff) >> 3) + (this->super_Header).super_Header6.m_ui16PDULength + 8;
  }
  return;
}

Assistant:

void Environmental_Process_PDU::SetEnvironmentRecords( const vector<EnvironmentRecordPtr> & ER )
{
    // Reset the PDU length.
    m_ui16PDULength = ENVIROMENTAL_PROCESS_PDU_SIZE;
    m_vEnvRecords = ER;
    m_ui16NumEnvRec = m_vEnvRecords.size();

    vector<EnvironmentRecordPtr>::const_iterator citr = m_vEnvRecords.begin();
    vector<EnvironmentRecordPtr>::const_iterator citrEnd = m_vEnvRecords.end();

    // Calculate the new PDU length
    for( ; citr != citrEnd; ++citr )
    {
        // GetLength returns value in bits so convert to bytes and add the header length
        m_ui16PDULength += EnvironmentRecord::ENVIRONMENT_RECORD_SIZE + ( ( *citr )->GetLength() / 8 );
    }
}